

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
::find_impl<phmap::priv::NonStandardLayout>
          (raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
           *this,key_arg<phmap::priv::NonStandardLayout> *key,size_t hashval,size_t *offset)

{
  char *pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  probe_seq<16UL> seq;
  __m128i match;
  probe_seq<16UL> local_80;
  EqualElement<phmap::priv::NonStandardLayout> local_68;
  undefined1 local_58 [16];
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  if (this->ctrl_ == (ctrl_t *)0x0) {
    bVar6 = false;
  }
  else {
    probe(&local_80,this,hashval);
    auVar7 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar7 = pshuflw(auVar7,auVar7,0);
    local_58._0_4_ = auVar7._0_4_;
    local_58._4_4_ = local_58._0_4_;
    local_58._8_4_ = local_58._0_4_;
    local_58._12_4_ = local_58._0_4_;
    while( true ) {
      pcVar1 = this->ctrl_ + local_80.offset_;
      local_48 = *pcVar1;
      cStack_47 = pcVar1[1];
      cStack_46 = pcVar1[2];
      cStack_45 = pcVar1[3];
      cStack_44 = pcVar1[4];
      cStack_43 = pcVar1[5];
      cStack_42 = pcVar1[6];
      cStack_41 = pcVar1[7];
      cStack_40 = pcVar1[8];
      cStack_3f = pcVar1[9];
      cStack_3e = pcVar1[10];
      cStack_3d = pcVar1[0xb];
      cStack_3c = pcVar1[0xc];
      cStack_3b = pcVar1[0xd];
      cStack_3a = pcVar1[0xe];
      cStack_39 = pcVar1[0xf];
      auVar7[0] = -(local_58[0] == local_48);
      auVar7[1] = -(local_58[1] == cStack_47);
      auVar7[2] = -(local_58[2] == cStack_46);
      auVar7[3] = -(local_58[3] == cStack_45);
      auVar7[4] = -(local_58[4] == cStack_44);
      auVar7[5] = -(local_58[5] == cStack_43);
      auVar7[6] = -(local_58[6] == cStack_42);
      auVar7[7] = -(local_58[7] == cStack_41);
      auVar7[8] = -(local_58[8] == cStack_40);
      auVar7[9] = -(local_58[9] == cStack_3f);
      auVar7[10] = -(local_58[10] == cStack_3e);
      auVar7[0xb] = -(local_58[0xb] == cStack_3d);
      auVar7[0xc] = -(local_58[0xc] == cStack_3c);
      auVar7[0xd] = -(local_58[0xd] == cStack_3b);
      auVar7[0xe] = -(local_58[0xe] == cStack_3a);
      auVar7[0xf] = -(local_58[0xf] == cStack_39);
      for (uVar4 = (uint)(ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(auVar7[0xf] >> 7) << 0xf); bVar6 = uVar4 != 0, bVar6;
          uVar4 = uVar4 - 1 & uVar4) {
        uVar2 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        uVar5 = uVar2 + local_80.offset_ & local_80.mask_;
        *offset = uVar5;
        local_68.rhs = key;
        local_68.eq = &(this->settings_).
                       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                       .
                       super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                       .
                       super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                       .super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl
        ;
        bVar3 = DecomposePair<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>::EqualElement<phmap::priv::NonStandardLayout>,std::pair<phmap::priv::NonStandardLayout_const,int>&>
                          (&local_68,this->slots_[uVar5]);
        if (bVar3) {
          return bVar6;
        }
      }
      auVar8[0] = -(local_48 == -0x80);
      auVar8[1] = -(cStack_47 == -0x80);
      auVar8[2] = -(cStack_46 == -0x80);
      auVar8[3] = -(cStack_45 == -0x80);
      auVar8[4] = -(cStack_44 == -0x80);
      auVar8[5] = -(cStack_43 == -0x80);
      auVar8[6] = -(cStack_42 == -0x80);
      auVar8[7] = -(cStack_41 == -0x80);
      auVar8[8] = -(cStack_40 == -0x80);
      auVar8[9] = -(cStack_3f == -0x80);
      auVar8[10] = -(cStack_3e == -0x80);
      auVar8[0xb] = -(cStack_3d == -0x80);
      auVar8[0xc] = -(cStack_3c == -0x80);
      auVar8[0xd] = -(cStack_3b == -0x80);
      auVar8[0xe] = -(cStack_3a == -0x80);
      auVar8[0xf] = -(cStack_39 == -0x80);
      if ((((((((((((((((auVar8 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar8 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar8 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar8 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar8 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar8 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar8 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar8 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar8 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar8 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar8 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar8 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cStack_39 == -0x80)
      break;
      local_80.index_ = local_80.index_ + 0x10;
      local_80.offset_ = local_80.index_ + local_80.offset_ & local_80.mask_;
    }
  }
  return bVar6;
}

Assistant:

bool find_impl(const key_arg<K>& PHMAP_RESTRICT key, size_t hashval, size_t& PHMAP_RESTRICT offset) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ ctrl_ + seq.offset() };
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                offset = seq.offset((size_t)i);
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                    EqualElement<K>{key, eq_ref()},
                    PolicyTraits::element(slots_ + offset))))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty()))
                return false;
            seq.next();
        }
    }